

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Highs.cpp
# Opt level: O1

HighsStatus __thiscall Highs::postsolve(Highs *this,HighsSolution *solution)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  HighsStatus HVar2;
  HighsBasis local_70;
  
  paVar1 = &local_70.debug_origin_name.field_2;
  local_70.valid = false;
  local_70.alien = true;
  local_70.useful = false;
  local_70.was_alien = true;
  local_70.debug_id = -1;
  local_70.debug_update_count = -1;
  local_70.debug_origin_name.field_2._M_allocated_capacity._0_4_ = 0x656e6f4e;
  local_70.debug_origin_name._M_string_length = 4;
  local_70.debug_origin_name.field_2._M_local_buf[4] = '\0';
  local_70.col_status.super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_70.col_status.super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_70.col_status.super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_70.row_status.super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_70.row_status.super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_70.row_status.super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_70.debug_origin_name._M_dataplus._M_p = (pointer)paVar1;
  HVar2 = postsolve(this,solution,&local_70);
  if (local_70.row_status.super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_70.row_status.
                    super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_70.col_status.super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_70.col_status.
                    super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70.debug_origin_name._M_dataplus._M_p != paVar1) {
    operator_delete(local_70.debug_origin_name._M_dataplus._M_p);
  }
  return HVar2;
}

Assistant:

HighsStatus Highs::postsolve(const HighsSolution& solution) {
  HighsBasis basis;
  return this->postsolve(solution, basis);
}